

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall ninx::lexer::Lexer::Lexer(Lexer *this,istream *stream,string *origin)

{
  this->stream = stream;
  std::__cxx11::string::string((string *)&this->origin,(string *)origin);
  Reader::Reader(&this->reader,stream,origin);
  this->verbose = false;
  return;
}

Assistant:

ninx::lexer::Lexer::Lexer(std::istream &stream, std::string origin) : stream{stream}, origin{origin},
                                                                      reader{Reader{stream, origin}} {
}